

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall
mkvparser::BlockGroup::BlockGroup
          (BlockGroup *this,Cluster *pCluster,long idx,longlong block_start,longlong block_size,
          longlong prev,longlong next,longlong duration,longlong discard_padding)

{
  (this->super_BlockEntry).m_pCluster = pCluster;
  (this->super_BlockEntry).m_index = idx;
  (this->super_BlockEntry)._vptr_BlockEntry = (_func_int **)&PTR__BlockGroup_0013bc78;
  (this->m_block).m_start = block_start;
  (this->m_block).m_size = block_size;
  (this->m_block).m_track = 0;
  (this->m_block).m_timecode = -1;
  (this->m_block).m_flags = '\0';
  (this->m_block).m_frames = (Frame *)0x0;
  (this->m_block).m_frame_count = -1;
  (this->m_block).m_discard_padding = discard_padding;
  this->m_prev = prev;
  this->m_next = next;
  this->m_duration = duration;
  return;
}

Assistant:

BlockGroup::BlockGroup(Cluster* pCluster, long idx, long long block_start,
                       long long block_size, long long prev, long long next,
                       long long duration, long long discard_padding)
    : BlockEntry(pCluster, idx),
      m_block(block_start, block_size, discard_padding),
      m_prev(prev),
      m_next(next),
      m_duration(duration) {}